

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnExport
          (SharedValidator *this,Location *loc,ExternalKind kind,Var *item_var,string_view name)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pcVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  Var local_218;
  Enum local_1cc;
  Var local_1c8;
  Enum local_17c;
  Var local_178;
  Enum local_12c;
  Var local_128;
  Enum local_dc;
  Var local_d8;
  Enum local_8c;
  _Base_ptr local_88;
  undefined1 local_80;
  Enum local_74;
  _Self local_70;
  _Self local_68;
  undefined1 local_60 [8];
  string name_str;
  Var *item_var_local;
  ExternalKind kind_local;
  Location *loc_local;
  SharedValidator *this_local;
  string_view name_local;
  Result result;
  
  name_local.data_ = (char *)name.size_;
  this_local = (SharedValidator *)name.data_;
  name_str.field_2._8_8_ = item_var;
  Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  string_view::to_string_abi_cxx11_((string *)local_60,(string_view *)&this_local);
  local_68._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(&this->export_names_,(key_type *)local_60);
  local_70._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->export_names_);
  bVar1 = std::operator!=(&local_68,&local_70);
  if (bVar1) {
    sVar2 = string_view::length((string_view *)&this_local);
    pcVar3 = string_view::data((string_view *)&this_local);
    local_74 = (Enum)PrintError(this,loc,"duplicate export \"%.*s\"",sVar2 & 0xffffffff,pcVar3);
    Result::operator|=((Result *)((long)&name_local.size_ + 4),(Result)local_74);
  }
  pVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->export_names_,(value_type *)local_60);
  local_88 = (_Base_ptr)pVar4.first._M_node;
  local_80 = pVar4.second;
  switch(kind) {
  case First:
    Var::Var(&local_d8,item_var);
    local_8c = (Enum)CheckFuncIndex(this,&local_d8,(FuncType *)0x0);
    Result::operator|=((Result *)((long)&name_local.size_ + 4),(Result)local_8c);
    Var::~Var(&local_d8);
    break;
  case Table:
    Var::Var(&local_128,item_var);
    local_dc = (Enum)CheckTableIndex(this,&local_128,(TableType *)0x0);
    Result::operator|=((Result *)((long)&name_local.size_ + 4),(Result)local_dc);
    Var::~Var(&local_128);
    break;
  case Memory:
    Var::Var(&local_178,item_var);
    local_12c = (Enum)CheckMemoryIndex(this,&local_178,(MemoryType *)0x0);
    Result::operator|=((Result *)((long)&name_local.size_ + 4),(Result)local_12c);
    Var::~Var(&local_178);
    break;
  case Global:
    Var::Var(&local_1c8,item_var);
    local_17c = (Enum)CheckGlobalIndex(this,&local_1c8,(GlobalType *)0x0);
    Result::operator|=((Result *)((long)&name_local.size_ + 4),(Result)local_17c);
    Var::~Var(&local_1c8);
    break;
  case Event:
    Var::Var(&local_218,item_var);
    local_1cc = (Enum)CheckEventIndex(this,&local_218,(EventType *)0x0);
    Result::operator|=((Result *)((long)&name_local.size_ + 4),(Result)local_1cc);
    Var::~Var(&local_218);
  }
  std::__cxx11::string::~string((string *)local_60);
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result SharedValidator::OnExport(const Location& loc,
                                 ExternalKind kind,
                                 Var item_var,
                                 string_view name) {
  Result result = Result::Ok;
  auto name_str = name.to_string();
  if (export_names_.find(name_str) != export_names_.end()) {
    result |= PrintError(loc, "duplicate export \"" PRIstringview "\"",
                         WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  export_names_.insert(name_str);

  switch (kind) {
    case ExternalKind::Func:
      result |= CheckFuncIndex(item_var);
      break;

    case ExternalKind::Table:
      result |= CheckTableIndex(item_var);
      break;

    case ExternalKind::Memory:
      result |= CheckMemoryIndex(item_var);
      break;

    case ExternalKind::Global:
      result |= CheckGlobalIndex(item_var);
      break;

    case ExternalKind::Event:
      result |= CheckEventIndex(item_var);
      break;
  }
  return result;
}